

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_31;
  path local_30;
  
  std::filesystem::__cxx11::path::path<char[39],std::filesystem::__cxx11::path>
            (&local_30,(char (*) [39])"/home/fourstring/CLionProjects/lsmtree",auto_format);
  std::filesystem::current_path(&local_30);
  std::filesystem::__cxx11::path::~path(&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should be able to move a memtable",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_memtable_move);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should distinguish two strings by space in a binary file",
             &local_31);
  it<bool(*)()>(&local_30._M_pathname,test_string_fileio);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should read/write number as bytes correctly",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_bytes_level_IO);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should follow definition of MemTable",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_memtable_behavior);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should correctly implement SSTable",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_SSTable_behavior);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "should correctly read/write bytes between SSTable in memory and disk.",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_SSTable_fileIO);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should correctly implement DiskTableNode",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_DiskTableNode_behavior);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should merge data correctly",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_SSTableData_merge);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should correctly erase data in vector",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_vector_erase);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"should read sstable correctly",&local_31);
  it<bool(*)()>(&local_30._M_pathname,test_SSTable_input);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int main() {
    current_path("/home/fourstring/CLionProjects/lsmtree");
    it("should be able to move a memtable", test_memtable_move);
    it("should distinguish two strings by space in a binary file", test_string_fileio);
    it("should read/write number as bytes correctly", test_bytes_level_IO);
    it("should follow definition of MemTable", test_memtable_behavior);
    it("should correctly implement SSTable", test_SSTable_behavior);
    it("should correctly read/write bytes between SSTable in memory and disk.", test_SSTable_fileIO);
    it("should correctly implement DiskTableNode", test_DiskTableNode_behavior);
    it("should merge data correctly", test_SSTableData_merge);
    it("should correctly erase data in vector", test_vector_erase);
    it("should read sstable correctly", test_SSTable_input);
}